

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O2

void Js::JavascriptNativeOperators::TracePropertyEquivalenceCheck
               (JitEquivalentTypeGuard *guard,Type *type,Type *refType,bool isEquivalent,
               uint failedPropertyIndex)

{
  EquivalentTypeCache *pEVar1;
  EquivalentPropertyEntry *pEVar2;
  bool bVar3;
  ScriptContext *this;
  PropertyRecord *pPVar4;
  ulong uVar5;
  uint pi;
  ulong uVar6;
  undefined4 local_34;
  PropertyEquivalenceInfo info;
  
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase);
  if (bVar3) {
    uVar5 = (ulong)(guard->cache->record).propertyCount;
    Output::Print(L"EquivObjTypeSpec: checking %u properties on operation %u, (type = 0x%p, ref type = 0x%p):\n"
                  ,uVar5,(ulong)guard->objTypeSpecFldId,type,refType);
    pEVar1 = guard->cache;
    this = Js::Type::GetScriptContext(type);
    if (isEquivalent) {
      if (DAT_0145948a == '\x01') {
        Output::Print(L"    <start>, ");
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          pEVar2 = (pEVar1->record).properties;
          pPVar4 = ScriptContext::GetPropertyName(this,pEVar2[uVar6].propertyId);
          Output::Print(L"%s(#%d)@%ua%dw%d, ",pPVar4 + 1,(ulong)(uint)pPVar4->pid,
                        (ulong)pEVar2[uVar6].slotIndex,(ulong)pEVar2[uVar6].isAuxSlot,
                        (ulong)pEVar2[uVar6].mustBeWritable);
        }
        Output::Print(L"<end>\n");
      }
    }
    else {
      pEVar2 = (pEVar1->record).properties;
      local_34 = 0xffff;
      pPVar4 = ScriptContext::GetPropertyName(this,pEVar2[failedPropertyIndex].propertyId);
      bVar3 = DynamicType::Is(type);
      if (bVar3) {
        (**(code **)(**(long **)(type + 1) + 0x68))(*(long **)(type + 1),pPVar4,&local_34);
      }
      Output::Print(L"EquivObjTypeSpec: check failed for %s (#%d) on operation %u:\n",pPVar4 + 1,
                    (ulong)(uint)pPVar4->pid,(ulong)guard->objTypeSpecFldId);
      Output::Print(L"    type = 0x%p, ref type = 0x%p, slot = 0x%u (%d), ref slot = 0x%u (%d), is writable = %d, required writable = %d\n"
                    ,type,refType,(ulong)(ushort)local_34,
                    (ulong)pEVar2[failedPropertyIndex].slotIndex,(ulong)local_34._2_1_,
                    (ulong)pEVar2[failedPropertyIndex].isAuxSlot,(ulong)local_34._3_1_,
                    (ulong)pEVar2[failedPropertyIndex].mustBeWritable);
    }
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptNativeOperators::TracePropertyEquivalenceCheck(const JitEquivalentTypeGuard* guard, const Type* type, const Type* refType, bool isEquivalent, uint failedPropertyIndex)
    {
        if (PHASE_TRACE1(Js::EquivObjTypeSpecPhase))
        {
            uint propertyCount = guard->GetCache()->record.propertyCount;

            Output::Print(_u("EquivObjTypeSpec: checking %u properties on operation %u, (type = 0x%p, ref type = 0x%p):\n"),
                propertyCount, guard->GetObjTypeSpecFldId(), type, refType);

            const Js::TypeEquivalenceRecord& record = guard->GetCache()->record;
            ScriptContext* scriptContext = type->GetScriptContext();
            if (isEquivalent)
            {
                if (Js::Configuration::Global.flags.Verbose)
                {
                    Output::Print(_u("    <start>, "));
                    for (uint pi = 0; pi < propertyCount; pi++)
                    {
                        const EquivalentPropertyEntry* refInfo = &record.properties[pi];
                        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(refInfo->propertyId);
                        Output::Print(_u("%s(#%d)@%ua%dw%d, "), propertyRecord->GetBuffer(), propertyRecord->GetPropertyId(), refInfo->slotIndex, refInfo->isAuxSlot, refInfo->mustBeWritable);
                    }
                    Output::Print(_u("<end>\n"));
                }
            }
            else
            {
                const EquivalentPropertyEntry* refInfo = &record.properties[failedPropertyIndex];
                Js::PropertyEquivalenceInfo info(Constants::NoSlot, false, false);
                const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(refInfo->propertyId);
                if (DynamicType::Is(type))
                {
                    Js::DynamicTypeHandler* typeHandler = (static_cast<const DynamicType*>(type))->GetTypeHandler();
                    typeHandler->GetPropertyEquivalenceInfo(propertyRecord, info);
                }

                Output::Print(_u("EquivObjTypeSpec: check failed for %s (#%d) on operation %u:\n"),
                    propertyRecord->GetBuffer(), propertyRecord->GetPropertyId(), guard->GetObjTypeSpecFldId());
                Output::Print(_u("    type = 0x%p, ref type = 0x%p, slot = 0x%u (%d), ref slot = 0x%u (%d), is writable = %d, required writable = %d\n"),
                    type, refType, info.slotIndex, refInfo->slotIndex, info.isAuxSlot, refInfo->isAuxSlot, info.isWritable, refInfo->mustBeWritable);
            }

            Output::Flush();
        }
    }